

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * ghc::filesystem::canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  impl_string_type *piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  error_category *peVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  int *piVar10;
  size_type sVar11;
  char *pcVar12;
  bool bVar13;
  char *local_1f0;
  long local_1e8;
  char local_1e0 [16];
  path local_1d0;
  ulong local_1b0;
  path work;
  path pe;
  file_status fs;
  iterator __begin3;
  path target;
  iterator __end3;
  
  uVar9 = (p->_path)._M_string_length;
  if (uVar9 == 0) {
    peVar7 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar7;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  if (uVar9 < 3) {
    uVar6 = 0;
LAB_0011d10c:
    pcVar12 = (p->_path)._M_dataplus._M_p;
    if (pcVar12[uVar6] != '/') goto LAB_0011d134;
LAB_0011d116:
    work._path._M_dataplus._M_p = (pointer)&work._path.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&work,pcVar12,pcVar12 + uVar9);
  }
  else {
    pcVar12 = (p->_path)._M_dataplus._M_p;
    if (*pcVar12 == '/') {
      if (((pcVar12[1] != '/') || (pcVar12[2] == 0x2f)) ||
         (iVar4 = isprint((int)pcVar12[2]), iVar4 == 0)) goto LAB_0011d116;
      uVar6 = std::__cxx11::string::find((char)p,0x2f);
      uVar9 = (p->_path)._M_string_length;
      if (uVar6 == 0xffffffffffffffff) {
        uVar6 = uVar9;
      }
      if (uVar6 < uVar9) goto LAB_0011d10c;
    }
LAB_0011d134:
    absolute(&work,p,ec);
  }
  local_1d0._path._M_dataplus._M_p = (pointer)((long)&local_1d0 + 0x10);
  local_1d0._path._M_string_length = 0;
  local_1d0._path.field_2._M_local_buf[0] = '\0';
  detail::status_ex((path *)&fs,(error_code *)&work,(file_status *)ec,(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)0x0,0);
  if (ec->_M_value == 0) {
    if (fs._type != not_found) {
      paVar8 = &target._path.field_2;
      paVar1 = &(__return_storage_ptr__->_path).field_2;
      do {
        if (work._path._M_string_length < 3) {
          sVar11 = 0;
          uVar9 = 0;
LAB_0011d2a6:
          if (uVar9 < work._path._M_string_length) {
            local_1b0 = (ulong)(work._path._M_dataplus._M_p[uVar9] == '/');
          }
          else {
LAB_0011d2c0:
            local_1b0 = 0;
          }
        }
        else {
          if (((*work._path._M_dataplus._M_p == '/') && (work._path._M_dataplus._M_p[1] == '/')) &&
             (work._path._M_dataplus._M_p[2] != 0x2f)) {
            iVar4 = isprint((int)work._path._M_dataplus._M_p[2]);
            if (iVar4 == 0) {
              sVar11 = 0;
            }
            else {
              sVar11 = std::__cxx11::string::find((char)&work,0x2f);
              if (sVar11 == 0xffffffffffffffff) {
                sVar11 = work._path._M_string_length;
              }
              if (work._path._M_string_length < 3) {
                uVar9 = 0;
                goto LAB_0011d2a6;
              }
            }
          }
          else {
            sVar11 = 0;
          }
          if (*work._path._M_dataplus._M_p != '/') goto LAB_0011d2c0;
          local_1b0 = 1;
          if (((work._path._M_dataplus._M_p[1] == '/') && (work._path._M_dataplus._M_p[2] != 0x2f))
             && (iVar4 = isprint((int)work._path._M_dataplus._M_p[2]), iVar4 != 0)) {
            uVar9 = std::__cxx11::string::find((char)&work,0x2f);
            if (uVar9 == 0xffffffffffffffff) {
              uVar9 = work._path._M_string_length;
            }
            goto LAB_0011d2a6;
          }
        }
        local_1d0._path._M_string_length = 0;
        *local_1d0._path._M_dataplus._M_p = '\0';
        target._path._M_dataplus = work._path._M_dataplus;
        path::iterator::iterator(&__begin3,&work,(const_iterator *)&target);
        target._path._M_dataplus._M_p = work._path._M_dataplus._M_p + work._path._M_string_length;
        path::iterator::iterator(&__end3,&work,(const_iterator *)&target);
        local_1b0 = local_1b0 + sVar11;
        bVar3 = false;
        while (__begin3._iter._M_current != __end3._iter._M_current) {
          pe._path._M_dataplus._M_p = (pointer)&pe._path.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pe,__begin3._current._path._M_dataplus._M_p,
                     __begin3._current._path._M_dataplus._M_p +
                     __begin3._current._path._M_string_length);
          iVar4 = 5;
          if (pe._path._M_string_length != 0) {
            path::path<char[2],ghc::filesystem::path>(&target,(char (*) [2])0x146071,auto_format);
            iVar5 = path::compare(&pe,&target);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)target._path._M_dataplus._M_p != paVar8) {
              operator_delete(target._path._M_dataplus._M_p);
            }
            if (iVar5 != 0) {
              path::path<char[3],ghc::filesystem::path>(&target,(char (*) [3])"..",auto_format);
              iVar5 = path::compare(&pe,&target);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)target._path._M_dataplus._M_p != paVar8) {
                operator_delete(target._path._M_dataplus._M_p);
              }
              if (iVar5 == 0) {
                path::parent_path(&target,&local_1d0);
                std::__cxx11::string::operator=((string *)&local_1d0,(string *)&target);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)target._path._M_dataplus._M_p != paVar8) {
                  operator_delete(target._path._M_dataplus._M_p);
                }
              }
              else {
                local_1f0 = local_1e0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1f0,local_1d0._path._M_dataplus._M_p,
                           local_1d0._path._M_dataplus._M_p + local_1d0._path._M_string_length);
                path::operator/=((path *)&local_1f0,&pe);
                target._path._M_dataplus._M_p = (pointer)paVar8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&target,local_1f0,local_1f0 + local_1e8);
                sVar11 = target._path._M_string_length;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)target._path._M_dataplus._M_p != paVar8) {
                  operator_delete(target._path._M_dataplus._M_p);
                }
                if (local_1f0 != local_1e0) {
                  operator_delete(local_1f0);
                }
                if (local_1b0 < sVar11) {
                  local_1f0 = local_1e0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1f0,local_1d0._path._M_dataplus._M_p,
                             local_1d0._path._M_dataplus._M_p + local_1d0._path._M_string_length);
                  path::operator/=((path *)&local_1f0,&pe);
                  iVar4 = lstat(local_1f0,(stat *)&target);
                  if (iVar4 == 0) {
                    peVar7 = (error_category *)std::_V2::system_category();
                    ec->_M_value = 0;
                    ec->_M_cat = peVar7;
                    bVar13 = (target._path.field_2._8_4_ & 0xf000) == 0xa000;
                    iVar4 = 0;
                  }
                  else {
                    piVar10 = __errno_location();
                    iVar4 = *piVar10;
                    peVar7 = (error_category *)std::_V2::system_category();
                    ec->_M_value = iVar4;
                    ec->_M_cat = peVar7;
                    bVar13 = false;
                  }
                  if (local_1f0 != local_1e0) {
                    operator_delete(local_1f0);
                    iVar4 = ec->_M_value;
                  }
                  if (iVar4 == 0) {
                    if (bVar13) {
                      local_1f0 = local_1e0;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_1f0,local_1d0._path._M_dataplus._M_p,
                                 local_1d0._path._M_dataplus._M_p + local_1d0._path._M_string_length
                                );
                      path::operator/=((path *)&local_1f0,&pe);
                      read_symlink(&target,(path *)&local_1f0,ec);
                      if (local_1f0 != local_1e0) {
                        operator_delete(local_1f0);
                      }
                      if (ec->_M_value == 0) {
                        if (target._path._M_string_length < 3) {
                          uVar9 = 0;
LAB_0011d6b9:
                          if ((target._path._M_string_length <= uVar9) ||
                             (target._path._M_dataplus._M_p[uVar9] != '/')) {
LAB_0011d6e1:
                            iVar4 = 5;
                            path::operator/=(&local_1d0,&target);
                            goto LAB_0011d6f4;
                          }
                        }
                        else {
                          if (*target._path._M_dataplus._M_p != '/') goto LAB_0011d6e1;
                          if (((target._path._M_dataplus._M_p[1] == '/') &&
                              (target._path._M_dataplus._M_p[2] != 0x2f)) &&
                             (iVar4 = isprint((int)target._path._M_dataplus._M_p[2]), iVar4 != 0)) {
                            uVar9 = std::__cxx11::string::find((char)(stat *)&target,0x2f);
                            if (uVar9 == 0xffffffffffffffff) {
                              uVar9 = target._path._M_string_length;
                            }
                            goto LAB_0011d6b9;
                          }
                        }
                        iVar4 = 5;
                        std::__cxx11::string::_M_assign((string *)&local_1d0);
                      }
                      else {
                        (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
                        (__return_storage_ptr__->_path)._M_string_length = 0;
                        (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
                        iVar4 = 1;
                      }
LAB_0011d6f4:
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)target._path._M_dataplus._M_p != paVar8) {
                        operator_delete(target._path._M_dataplus._M_p);
                      }
                      bVar3 = true;
                    }
                    else {
                      iVar4 = 0;
                      path::operator/=(&local_1d0,&pe);
                    }
                  }
                  else {
                    (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
                    (__return_storage_ptr__->_path)._M_string_length = 0;
                    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
                    iVar4 = 1;
                  }
                }
                else {
                  path::operator/=(&local_1d0,&pe);
                }
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pe._path._M_dataplus._M_p != &pe._path.field_2) {
            operator_delete(pe._path._M_dataplus._M_p);
          }
          if ((iVar4 != 5) && (iVar4 != 0)) goto LAB_0011d74c;
          path::iterator::operator++(&__begin3);
        }
        iVar4 = 4;
LAB_0011d74c:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__end3._current._path._M_dataplus._M_p != &__end3._current._path.field_2) {
          operator_delete(__end3._current._path._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__begin3._current._path._M_dataplus._M_p != &__begin3._current._path.field_2) {
          operator_delete(__begin3._current._path._M_dataplus._M_p);
        }
        if (iVar4 != 0) {
          if (iVar4 != 4) goto LAB_0011d1b0;
          std::__cxx11::string::_M_assign((string *)&work);
        }
      } while (bVar3);
      peVar7 = (error_category *)std::_V2::system_category();
      ec->_M_value = 0;
      ec->_M_cat = peVar7;
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&local_1d0 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._path._M_dataplus._M_p == paVar8) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_1d0._path.field_2._M_allocated_capacity._1_7_,
                      local_1d0._path.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) =
             local_1d0._path.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_path)._M_dataplus._M_p = local_1d0._path._M_dataplus._M_p;
        (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
             CONCAT71(local_1d0._path.field_2._M_allocated_capacity._1_7_,
                      local_1d0._path.field_2._M_local_buf[0]);
      }
      piVar2 = &local_1d0._path;
      (__return_storage_ptr__->_path)._M_string_length = local_1d0._path._M_string_length;
      local_1d0._path._M_dataplus._M_p = (pointer)paVar8;
      goto LAB_0011d1a6;
    }
    peVar7 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar7;
  }
  paVar8 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar8;
  piVar2 = &__return_storage_ptr__->_path;
LAB_0011d1a6:
  piVar2->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
LAB_0011d1b0:
  if (local_1d0._path._M_dataplus._M_p != (pointer)((long)&local_1d0 + 0x10)) {
    operator_delete(local_1d0._path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)work._path._M_dataplus._M_p != &work._path.field_2) {
    operator_delete(work._path._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        auto rootPathLen = work._prefixLength + work.root_name_length() + (work.has_root_directory() ? 1 : 0);
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= rootPathLen) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}